

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dijkstra.h
# Opt level: O3

void search_min(vector<int,_std::allocator<int>_> *array,
               vector<bool,_std::allocator<bool>_> *conditional,int *min_dist)

{
  int iVar1;
  pointer ptVar2;
  int iVar3;
  int iVar4;
  thread *thread;
  pointer ptVar5;
  int iVar6;
  int b;
  int a;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  int local_88;
  int local_84;
  thread local_80;
  vector<std::thread,_std::allocator<std::thread>_> local_78;
  vector<bool,_std::allocator<bool>_> *local_58;
  int *local_50;
  reference_wrapper<int> local_48;
  reference_wrapper<std::vector<bool,_std::allocator<bool>_>_> local_40;
  reference_wrapper<std::vector<int,_std::allocator<int>_>_> local_38;
  
  local_78.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = (int)((ulong)((long)(array->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(array->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 5);
  iVar4 = 8;
  iVar6 = 0;
  local_58 = conditional;
  local_50 = min_dist;
  while( true ) {
    iVar3 = iVar1 + iVar6;
    local_88 = (int)((ulong)((long)(array->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(array->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_start) >> 2) + -1;
    if (iVar3 <= local_88) {
      local_88 = iVar3;
    }
    local_40._M_data = local_58;
    local_48._M_data = local_50;
    local_84 = iVar6;
    local_38._M_data = array;
    std::thread::
    thread<void(&)(std::vector<int,std::allocator<int>>&,std::vector<bool,std::allocator<bool>>&,int,int,int&),std::reference_wrapper<std::vector<int,std::allocator<int>>>,std::reference_wrapper<std::vector<bool,std::allocator<bool>>>,int&,int&,std::reference_wrapper<int>,void>
              (&local_80,search_min_f_dijkstra,&local_38,&local_40,&local_84,&local_88,&local_48);
    std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
              (&local_78,&local_80);
    ptVar2 = local_78.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_80._M_id._M_thread != 0) break;
    iVar6 = iVar6 + iVar1 + 1;
    iVar4 = iVar4 + -1;
    ptVar5 = local_78.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar4 == 0) {
      for (; ptVar5 != ptVar2; ptVar5 = ptVar5 + 1) {
        if ((ptVar5->_M_id)._M_thread != 0) {
          std::thread::join();
        }
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_78);
      return;
    }
  }
  std::terminate();
}

Assistant:

void search_min(vector<int>& array, vector<bool>& conditional, int& min_dist){
    int num_workers = 8;
    vector<thread> threads;

    int a, b;
    int step = array.size() / num_workers;
    for (int w=0; w<num_workers; w++){
        a = w*(step+1);
        b = min(a+step, (int)array.size()-1);
        threads.push_back(thread(search_min_f_dijkstra, ref(array), ref(conditional), a, b, ref(min_dist)));
    }
    for (auto & thread : threads) {
        if (thread.joinable()) {
            thread.join();
        }
    }
}